

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O0

void __thiscall push_marker_options_t::~push_marker_options_t(push_marker_options_t *this)

{
  push_marker_options_t *this_local;
  
  std::__cxx11::string::~string((string *)&this->media_string_);
  std::__cxx11::string::~string((string *)&this->init_string_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

push_marker_options_t()
        : url_("http://localhost/test01/test01.isml")
        , dry_run_(false)
        , avail_interval_(60000)
        , avail_dur_(10000)
        , seg_dur_(2000)
        , timescale_(1000)
        , track_id_(1)
        , announce_(0)
        , send_vtt_(false)
        , send_event_(true)
        , media_string_("")
        , init_string_("")
        , splice_immediate_(false)
    {
    }